

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

cmGlobalGenerator * __thiscall cmake::CreateGlobalGenerator(cmake *this,string *gname)

{
  const_iterator cVar1;
  bool bVar2;
  int iVar3;
  pointer ppVar4;
  reference ppcVar5;
  undefined4 extraout_var;
  __normal_iterator<cmGlobalGeneratorFactory_**,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
  local_b0;
  __normal_iterator<cmGlobalGeneratorFactory_**,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
  local_a8;
  __normal_iterator<cmGlobalGeneratorFactory_*const_*,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
  local_a0;
  const_iterator i;
  cmGlobalGenerator *generator;
  iterator local_70;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>
  local_68 [3];
  iterator local_50;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>
  local_48;
  const_iterator extraGenIt;
  string name;
  cmExternalMakefileProjectGenerator *extraGenerator;
  string *gname_local;
  cmake *this_local;
  
  name.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)&extraGenIt,(string *)gname);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>_>
       ::find(&this->ExtraGenerators,(key_type *)&extraGenIt);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>
  ::_Rb_tree_const_iterator(&local_48,&local_50);
  local_70._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>_>
       ::end(&this->ExtraGenerators);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>
  ::_Rb_tree_const_iterator(local_68,&local_70);
  bVar2 = std::operator!=(&local_48,local_68);
  if (bVar2) {
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>
             ::operator->(&local_48);
    name.field_2._8_8_ = (*ppVar4->second)();
    cmExternalMakefileProjectGenerator::GetGlobalGeneratorName
              ((string *)&generator,(cmExternalMakefileProjectGenerator *)name.field_2._8_8_,
               (string *)&extraGenIt);
    std::__cxx11::string::operator=((string *)&extraGenIt,(string *)&generator);
    std::__cxx11::string::~string((string *)&generator);
  }
  i._M_current = (cmGlobalGeneratorFactory **)0x0;
  local_a8._M_current =
       (cmGlobalGeneratorFactory **)
       std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>::begin
                 (&this->Generators);
  __gnu_cxx::
  __normal_iterator<cmGlobalGeneratorFactory*const*,std::vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>>>
  ::__normal_iterator<cmGlobalGeneratorFactory**>
            ((__normal_iterator<cmGlobalGeneratorFactory*const*,std::vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>>>
              *)&local_a0,&local_a8);
  while( true ) {
    local_b0._M_current =
         (cmGlobalGeneratorFactory **)
         std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>::end
                   (&this->Generators);
    bVar2 = __gnu_cxx::operator!=(&local_a0,&local_b0);
    if (!bVar2) break;
    ppcVar5 = __gnu_cxx::
              __normal_iterator<cmGlobalGeneratorFactory_*const_*,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
              ::operator*(&local_a0);
    iVar3 = (*(*ppcVar5)->_vptr_cmGlobalGeneratorFactory[2])(*ppcVar5,&extraGenIt,this);
    i._M_current = (cmGlobalGeneratorFactory **)CONCAT44(extraout_var,iVar3);
    if (i._M_current != (cmGlobalGeneratorFactory **)0x0) break;
    __gnu_cxx::
    __normal_iterator<cmGlobalGeneratorFactory_*const_*,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
    ::operator++(&local_a0);
  }
  if (i._M_current == (cmGlobalGeneratorFactory **)0x0) {
    if (name.field_2._8_8_ != 0) {
      (**(code **)(*(long *)name.field_2._8_8_ + 8))();
    }
  }
  else {
    cmGlobalGenerator::SetExternalMakefileProjectGenerator
              ((cmGlobalGenerator *)i._M_current,
               (cmExternalMakefileProjectGenerator *)name.field_2._8_8_);
  }
  cVar1._M_current = i._M_current;
  std::__cxx11::string::~string((string *)&extraGenIt);
  return (cmGlobalGenerator *)cVar1._M_current;
}

Assistant:

cmGlobalGenerator* cmake::CreateGlobalGenerator(const std::string& gname)
{
  cmExternalMakefileProjectGenerator* extraGenerator = 0;
  std::string name = gname;
  RegisteredExtraGeneratorsMap::const_iterator extraGenIt =
                                            this->ExtraGenerators.find(name);
  if (extraGenIt != this->ExtraGenerators.end())
    {
    extraGenerator = (extraGenIt->second)();
    name = extraGenerator->GetGlobalGeneratorName(name);
    }

  cmGlobalGenerator* generator = 0;
  for (RegisteredGeneratorsVector::const_iterator i =
    this->Generators.begin(); i != this->Generators.end(); ++i)
    {
    generator = (*i)->CreateGlobalGenerator(name, this);
    if (generator)
      {
      break;
      }
    }

  if (generator)
    {
    generator->SetExternalMakefileProjectGenerator(extraGenerator);
    }
  else
    {
    delete extraGenerator;
    }

  return generator;
}